

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSExporter.cpp
# Opt level: O0

int __thiscall
Assimp::Discreet3DSExporter::WriteHierarchy
          (Discreet3DSExporter *this,aiNode *node,int seq,int sibling_level)

{
  uint uVar1;
  uint uVar2;
  aiMesh *this_00;
  int iVar3;
  aiNode *in_R8;
  int local_e4;
  int local_cc;
  string local_a8;
  undefined1 local_88 [8];
  ChunkWriter chunk_3;
  ChunkWriter chunk_2;
  aiMesh *mesh;
  uint mesh_idx;
  uint uStack_54;
  bool first_child;
  uint i_1;
  uint i;
  int16_t hierarchy_pos;
  undefined1 local_40 [8];
  ChunkWriter chunk_1;
  ChunkWriter chunk;
  int sibling_level_local;
  int seq_local;
  aiNode *node_local;
  Discreet3DSExporter *this_local;
  
  anon_unknown_0::ChunkWriter::ChunkWriter
            ((ChunkWriter *)&chunk_1.chunk_start_pos,&this->writer,0xb002);
  anon_unknown_0::ChunkWriter::ChunkWriter((ChunkWriter *)local_40,&this->writer,0xb010);
  WriteString(this,&node->mName);
  StreamWriter<false,_false>::PutI4(&this->writer,0);
  i_1._2_2_ = (int16_t)seq;
  if (sibling_level != -1) {
    i_1._2_2_ = (int16_t)sibling_level;
  }
  StreamWriter<false,_false>::PutI2(&this->writer,i_1._2_2_);
  anon_unknown_0::ChunkWriter::~ChunkWriter((ChunkWriter *)local_40);
  anon_unknown_0::ChunkWriter::~ChunkWriter((ChunkWriter *)&chunk_1.chunk_start_pos);
  iVar3 = seq + 1;
  chunk.chunk_start_pos._4_4_ = iVar3;
  for (uStack_54 = 0; uStack_54 < node->mNumChildren; uStack_54 = uStack_54 + 1) {
    local_cc = iVar3;
    if (uStack_54 == 0) {
      local_cc = -1;
    }
    chunk.chunk_start_pos._4_4_ =
         WriteHierarchy(this,node->mChildren[uStack_54],chunk.chunk_start_pos._4_4_,local_cc);
  }
  for (mesh_idx = 0; mesh_idx < node->mNumMeshes; mesh_idx = mesh_idx + 1) {
    uVar1 = node->mNumChildren;
    uVar2 = node->mMeshes[mesh_idx];
    this_00 = this->scene->mMeshes[uVar2];
    anon_unknown_0::ChunkWriter::ChunkWriter
              ((ChunkWriter *)&chunk_3.chunk_start_pos,&this->writer,0xb002);
    anon_unknown_0::ChunkWriter::ChunkWriter((ChunkWriter *)local_88,&this->writer,0xb010);
    (anonymous_namespace)::GetMeshName_abi_cxx11_
              (&local_a8,(_anonymous_namespace_ *)this_00,(aiMesh *)(ulong)uVar2,(uint)node,in_R8);
    WriteString(this,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    StreamWriter<false,_false>::PutI4(&this->writer,0);
    local_e4 = iVar3;
    if (uVar1 == 0 && mesh_idx == 0) {
      local_e4 = chunk.chunk_start_pos._4_4_;
    }
    StreamWriter<false,_false>::PutI2(&this->writer,(int16_t)local_e4);
    chunk.chunk_start_pos._4_4_ = chunk.chunk_start_pos._4_4_ + 1;
    anon_unknown_0::ChunkWriter::~ChunkWriter((ChunkWriter *)local_88);
    anon_unknown_0::ChunkWriter::~ChunkWriter((ChunkWriter *)&chunk_3.chunk_start_pos);
  }
  return chunk.chunk_start_pos._4_4_;
}

Assistant:

int Discreet3DSExporter::WriteHierarchy(const aiNode& node, int seq, int sibling_level)
{
    // 3DS scene hierarchy is serialized as in http://www.martinreddy.net/gfx/3d/3DS.spec
    {
        ChunkWriter chunk(writer, Discreet3DS::CHUNK_TRACKINFO);
        {
            ChunkWriter chunk(writer, Discreet3DS::CHUNK_TRACKOBJNAME);

            // Assimp node names are unique and distinct from all mesh-node
            // names we generate; thus we can use them as-is
            WriteString(node.mName);

            // Two unknown int16 values - it is even unclear if 0 is a safe value
            // but luckily importers do not know better either.
            writer.PutI4(0);

            int16_t hierarchy_pos = static_cast<int16_t>(seq);
            if (sibling_level != -1) {
                hierarchy_pos = sibling_level;
            }

            // Write the hierarchy position
            writer.PutI2(hierarchy_pos);
        }
    }

    // TODO: write transformation chunks

    ++seq;
    sibling_level = seq;

    // Write all children
    for (unsigned int i = 0; i < node.mNumChildren; ++i) {
        seq = WriteHierarchy(*node.mChildren[i], seq, i == 0 ? -1 : sibling_level);
    }

    // Write all meshes as separate nodes to be able to reference the meshes by name
    for (unsigned int i = 0; i < node.mNumMeshes; ++i) {
        const bool first_child = node.mNumChildren == 0 && i == 0;

        const unsigned int mesh_idx = node.mMeshes[i];
        const aiMesh& mesh = *scene->mMeshes[mesh_idx];

        ChunkWriter chunk(writer, Discreet3DS::CHUNK_TRACKINFO);
        {
            ChunkWriter chunk(writer, Discreet3DS::CHUNK_TRACKOBJNAME);
            WriteString(GetMeshName(mesh, mesh_idx, node));

            writer.PutI4(0);
            writer.PutI2(static_cast<int16_t>(first_child ? seq : sibling_level));
            ++seq;
        }
    }
    return seq;
}